

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CheckerInstanceBodySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CheckerInstanceBodySymbol,slang::ast::Compilation&,slang::ast::CheckerSymbol_const&,slang::ast::AssertionInstanceDetails&,slang::ast::ASTContext&,unsigned_int&,bool,slang::ast::InstanceFlags>
          (BumpAllocator *this,Compilation *args,CheckerSymbol *args_1,
          AssertionInstanceDetails *args_2,ASTContext *args_3,uint *args_4,bool *args_5,
          InstanceFlags *args_6)

{
  Compilation *compilation;
  ASTContext *in_RCX;
  undefined8 in_RDX;
  AssertionInstanceDetails *in_R8;
  undefined4 *in_R9;
  InstanceFlags *in_stack_00000010;
  size_t in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  BumpAllocator *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar1;
  undefined7 in_stack_ffffffffffffffc8;
  bitmask<slang::ast::InstanceFlags> in_stack_ffffffffffffffcf;
  
  compilation = (Compilation *)
                allocate(in_stack_ffffffffffffff98,
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
  uVar1 = *in_R9;
  bitmask<slang::ast::InstanceFlags>::bitmask
            ((bitmask<slang::ast::InstanceFlags> *)&stack0xffffffffffffffcf,*in_stack_00000010);
  ast::CheckerInstanceBodySymbol::CheckerInstanceBodySymbol
            ((CheckerInstanceBodySymbol *)
             CONCAT17(in_stack_ffffffffffffffcf.m_bits,in_stack_ffffffffffffffc8),compilation,
             (CheckerSymbol *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),in_R8,in_RCX,
             (uint32_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0),
             (bitmask<slang::ast::InstanceFlags>)(underlying_type)((ulong)in_R9 >> 0x38));
  return (CheckerInstanceBodySymbol *)compilation;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }